

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::PrintTriedExpectationsLocked
          (FunctionMocker<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
           *this,ArgumentTuple *args,ostream *why)

{
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  lVar5 = (long)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = lVar5 >> 4;
  poVar1 = std::operator<<(why,"Google Mock tried the following ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  pcVar2 = "expectations, but none matched";
  if (lVar5 == 0x10) {
    pcVar2 = "expectation, but it didn\'t match";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,":\n");
  lVar5 = 0;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    this_00 = *(TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                **)((long)&(((this->super_UntypedFunctionMockerBase).untyped_expectations_.
                             super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar5);
    std::operator<<(why,"\n");
    ExpectationBase::DescribeLocationTo(&this_00->super_ExpectationBase,why);
    if (1 < uVar3) {
      poVar1 = std::operator<<(why,"tried expectation #");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,": ");
    }
    poVar1 = std::operator<<(why,(this_00->super_ExpectationBase).source_text_._M_dataplus._M_p);
    std::operator<<(poVar1,"...\n");
    TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::ExplainMatchResultTo(this_00,args,why);
    ExpectationBase::DescribeCallCountTo(&this_00->super_ExpectationBase,why);
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const size_t count = untyped_expectations_.size();
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (size_t i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }